

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::checkInFlightQueries(CoreBroker *this,GlobalBrokerId brkid)

{
  bool bVar1;
  ActionMessage *cmd;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  size_type sVar2;
  reference pvVar3;
  __tuple_element_t<2UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *p_Var4;
  CoreBroker *in_RDI;
  int ii;
  string str;
  __tuple_element_t<1UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *requesters;
  __tuple_element_t<0UL,_tuple<JsonMapBuilder,_vector<ActionMessage,_allocator<ActionMessage>_>,_QueryReuse>_>
  *builder;
  tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
  *builderData;
  iterator __end1;
  iterator __begin1;
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  *__range1;
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  *in_stack_ffffffffffffff58;
  JsonMapBuilder *in_stack_ffffffffffffff60;
  GlobalBrokerId in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffbc;
  __normal_iterator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_*,_std::vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>_>
  local_20;
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  *local_18;
  GlobalBrokerId local_4;
  
  local_18 = &in_RDI->mapBuilders;
  local_20._M_current =
       (tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
        *)std::
          vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
          ::begin(in_stack_ffffffffffffff58);
  std::
  vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ::end(in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_*,_std::vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>_>
                      ((__normal_iterator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_*,_std::vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_*,_std::vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>_>
                        *)in_stack_ffffffffffffff58);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_*,_std::vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>_>
    ::operator*(&local_20);
    cmd = (ActionMessage *)
          std::
          get<0ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                    ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                      *)0x5e9ba7);
    this_00 = (DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)std::
                 get<1ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                           ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                             *)0x5e9bb6);
    bVar1 = fileops::JsonMapBuilder::isCompleted(in_stack_ffffffffffffff60);
    if (bVar1) break;
    GlobalBrokerId::baseValue(&local_4);
    bVar1 = fileops::JsonMapBuilder::clearComponents
                      ((JsonMapBuilder *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88.gid),
                       (int32_t)((ulong)in_RDI >> 0x20));
    if (bVar1) {
      fileops::JsonMapBuilder::generate_abi_cxx11_
                ((JsonMapBuilder *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88.gid)
                );
      for (local_64 = 0;
          sVar2 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::size
                            ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>
                              *)this_00), local_64 < (int)sVar2 + -1; local_64 = local_64 + 1) {
        pvVar3 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
                 operator[]((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *
                            )this_00,(long)local_64);
        bVar1 = GlobalFederateId::operator==
                          (&pvVar3->dest_id,
                           (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
        if (bVar1) {
          std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                    ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                     this_00,(long)local_64);
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::setDelayedValue(this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
        }
        else {
          std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                    ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                     this_00,(long)local_64);
          SmallBuffer::operator=
                    ((SmallBuffer *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88.gid),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
          std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::operator[]
                    ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                     this_00,(long)local_64);
          routeMessage(in_RDI,cmd);
        }
      }
      pvVar3 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                         ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                          in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff88.gid = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
      bVar1 = GlobalFederateId::operator==(&pvVar3->dest_id,in_stack_ffffffffffffff88);
      if (bVar1) {
        in_stack_ffffffffffffff60 = (JsonMapBuilder *)&in_RDI->activeQueries;
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   in_stack_ffffffffffffff60);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::setDelayedValue(this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0);
      }
      else {
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   in_stack_ffffffffffffff60);
        SmallBuffer::operator=
                  ((SmallBuffer *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88.gid),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   in_stack_ffffffffffffff60);
        routeMessage(in_RDI,cmd);
      }
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::clear
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)0x5e9dac);
      p_Var4 = std::
               get<2ul,helics::fileops::JsonMapBuilder,std::vector<helics::ActionMessage,std::allocator<helics::ActionMessage>>,helics::QueryReuse>
                         ((tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                           *)0x5e9db6);
      if (*p_Var4 == DISABLED) {
        fileops::JsonMapBuilder::reset(in_stack_ffffffffffffff60);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff60);
    }
    __gnu_cxx::
    __normal_iterator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_*,_std::vector<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void CoreBroker::checkInFlightQueries(GlobalBrokerId brkid)
{
    for (auto& builderData : mapBuilders) {
        auto& builder = std::get<0>(builderData);
        auto& requesters = std::get<1>(builderData);
        if (builder.isCompleted()) {
            return;
        }
        if (builder.clearComponents(brkid.baseValue())) {
            auto str = builder.generate();
            for (int ii = 0; ii < static_cast<int>(requesters.size()) - 1; ++ii) {
                if (requesters[ii].dest_id == global_broker_id_local) {
                    activeQueries.setDelayedValue(requesters[ii].messageID, str);
                } else {
                    requesters[ii].payload = str;
                    routeMessage(std::move(requesters[ii]));
                }
            }
            if (requesters.back().dest_id == global_broker_id_local) {
                activeQueries.setDelayedValue(requesters.back().messageID, std::move(str));
            } else {
                requesters.back().payload = std::move(str);
                routeMessage(std::move(requesters.back()));
            }

            requesters.clear();
            if (std::get<2>(builderData) == QueryReuse::DISABLED) {
                builder.reset();
            }
        }
    }
}